

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContext.cpp
# Opt level: O2

void __thiscall
sglr::Context::texSubImage2D
          (Context *this,deUint32 target,int level,int xoffset,int yoffset,Surface *src)

{
  uint uVar1;
  uint uVar2;
  ConstPixelBufferAccess local_58;
  
  uVar1 = src->m_width;
  uVar2 = src->m_height;
  tcu::Surface::getAccess(&local_58,src);
  (*this->_vptr_Context[0x14])
            (this,(ulong)target,(ulong)(uint)level,(ulong)(uint)xoffset,yoffset,(ulong)uVar1,
             (ulong)uVar2,0x1908,0x1401,local_58.m_data);
  return;
}

Assistant:

void Context::texSubImage2D (deUint32 target, int level, int xoffset, int yoffset, const tcu::Surface& src)
{
	int		width	= src.getWidth();
	int		height	= src.getHeight();
	texSubImage2D(target, level, xoffset, yoffset, width, height, GL_RGBA, GL_UNSIGNED_BYTE, src.getAccess().getDataPtr());
}